

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

size_t __thiscall
phmap::priv::
raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
::_find_key<phmap::priv::NonStandardLayout>
          (raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
           *this,NonStandardLayout *key,size_t hashval)

{
  char *pcVar1;
  ulong uVar2;
  uint uVar3;
  ushort uVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  bool bVar21;
  uint uVar22;
  ctrl_t *pcVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar33 [16];
  char cVar27;
  char cVar30;
  char cVar31;
  char cVar32;
  
  pcVar23 = this->ctrl_;
  if (pcVar23 != (ctrl_t *)0x0) {
    uVar2 = this->capacity_;
    if ((uVar2 + 1 & uVar2) != 0) {
      __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                    ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
    }
    uVar25 = hashval >> 7;
    auVar28 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
    auVar28 = pshuflw(auVar28,auVar28,0);
    lVar24 = 0;
    while( true ) {
      uVar25 = uVar25 & uVar2;
      pcVar1 = pcVar23 + uVar25;
      cVar5 = *pcVar1;
      cVar6 = pcVar1[1];
      cVar7 = pcVar1[2];
      cVar8 = pcVar1[3];
      cVar9 = pcVar1[4];
      cVar10 = pcVar1[5];
      cVar11 = pcVar1[6];
      cVar12 = pcVar1[7];
      cVar13 = pcVar1[8];
      cVar14 = pcVar1[9];
      cVar15 = pcVar1[10];
      cVar16 = pcVar1[0xb];
      cVar17 = pcVar1[0xc];
      cVar18 = pcVar1[0xd];
      cVar19 = pcVar1[0xe];
      cVar20 = pcVar1[0xf];
      cVar27 = auVar28[0];
      auVar29[0] = -(cVar27 == cVar5);
      cVar30 = auVar28[1];
      auVar29[1] = -(cVar30 == cVar6);
      cVar31 = auVar28[2];
      auVar29[2] = -(cVar31 == cVar7);
      cVar32 = auVar28[3];
      auVar29[3] = -(cVar32 == cVar8);
      auVar29[4] = -(cVar27 == cVar9);
      auVar29[5] = -(cVar30 == cVar10);
      auVar29[6] = -(cVar31 == cVar11);
      auVar29[7] = -(cVar32 == cVar12);
      auVar29[8] = -(cVar27 == cVar13);
      auVar29[9] = -(cVar30 == cVar14);
      auVar29[10] = -(cVar31 == cVar15);
      auVar29[0xb] = -(cVar32 == cVar16);
      auVar29[0xc] = -(cVar27 == cVar17);
      auVar29[0xd] = -(cVar30 == cVar18);
      auVar29[0xe] = -(cVar31 == cVar19);
      auVar29[0xf] = -(cVar32 == cVar20);
      uVar4 = (ushort)(SUB161(auVar29 >> 7,0) & 1) | (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe | (ushort)(auVar29[0xf] >> 7) << 0xf;
      if (uVar4 != 0) {
        uVar22 = (uint)uVar4;
        do {
          uVar3 = 0;
          if (uVar22 != 0) {
            for (; (uVar22 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
            }
          }
          uVar26 = uVar3 + uVar25 & uVar2;
          bVar21 = operator==(&this->slots_[uVar26]->first,key);
          if (bVar21) {
            return uVar26;
          }
          uVar22 = uVar22 - 1 & uVar22;
        } while (uVar22 != 0);
      }
      auVar33[0] = -(cVar5 == -0x80);
      auVar33[1] = -(cVar6 == -0x80);
      auVar33[2] = -(cVar7 == -0x80);
      auVar33[3] = -(cVar8 == -0x80);
      auVar33[4] = -(cVar9 == -0x80);
      auVar33[5] = -(cVar10 == -0x80);
      auVar33[6] = -(cVar11 == -0x80);
      auVar33[7] = -(cVar12 == -0x80);
      auVar33[8] = -(cVar13 == -0x80);
      auVar33[9] = -(cVar14 == -0x80);
      auVar33[10] = -(cVar15 == -0x80);
      auVar33[0xb] = -(cVar16 == -0x80);
      auVar33[0xc] = -(cVar17 == -0x80);
      auVar33[0xd] = -(cVar18 == -0x80);
      auVar33[0xe] = -(cVar19 == -0x80);
      auVar33[0xf] = -(cVar20 == -0x80);
      if ((((((((((((((((auVar33 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar33 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar33 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar33 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar33 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar33 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar33 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar33 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar33 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar33 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar33 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar33 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar20 == -0x80)
      break;
      uVar25 = uVar25 + lVar24 + 0x10;
      lVar24 = lVar24 + 0x10;
      pcVar23 = this->ctrl_;
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t _find_key(const K& PHMAP_RESTRICT key, size_t hashval) {
        PHMAP_IF_CONSTEXPR (!std_alloc_t::value) {
            // ctrl_ could be nullptr
            if (!ctrl_)
                return (size_t)-1;
        }
        auto seq = probe(hashval);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            for (uint32_t i : g.Match((h2_t)H2(hashval))) {
                if (PHMAP_PREDICT_TRUE(PolicyTraits::apply(
                                          EqualElement<K>{key, eq_ref()},
                                          PolicyTraits::element(slots_ + seq.offset((size_t)i)))))
                    return seq.offset((size_t)i);
            }
            if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) break;
            seq.next();
        }
        return (size_t)-1;
    }